

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall Lowerer::SplitBailForDebugger(Lowerer *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  BailOutKind BVar3;
  BailOutKind e1;
  undefined4 *puVar4;
  BailOutInfo *bailOutInfo_00;
  BailOutInstrTemplate<IR::Instr> *local_50;
  BailOutInstr *debuggerBailoutInstr;
  Instr *sharedBailoutInstr;
  BailOutInfo *bailOutInfo;
  BailOutInstrTemplate<IR::Instr> *pBStack_18;
  BailOutKind debuggerBailOutKind;
  Instr *instr_local;
  Lowerer *this_local;
  
  bVar2 = Func::IsJitInDebugMode(this->m_func);
  if ((!bVar2) || (instr->m_opcode == BailForDebugger)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3679,
                       "(m_func->IsJitInDebugMode() && instr->m_opcode != Js::OpCode::BailForDebugger)"
                       ,
                       "m_func->IsJitInDebugMode() && instr->m_opcode != Js::OpCode::BailForDebugger"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bailOutInfo_00 = IR::Instr::GetBailOutInfo(instr);
  debuggerBailoutInstr = (BailOutInstr *)0x0;
  BVar3 = IR::Instr::GetBailOutKind(instr);
  BVar3 = IR::operator&(BVar3,BailOutForDebuggerBits);
  if (BVar3 == BailOutInvalid) {
    bVar2 = IR::Instr::IsBranchInstr(instr);
    if (((bVar2) && (bVar2 = IR::Instr::HasBailOutInfo(instr), bVar2)) &&
       (bVar2 = IR::Instr::HasAuxBailOut(instr), bVar2)) {
      bailOutInfo._4_4_ = BailOutInvalid;
    }
    else {
      bVar2 = IR::Instr::HasAuxBailOut(instr);
      if (bVar2) {
        BVar3 = IR::Instr::GetAuxBailOutKind(instr);
        BVar3 = IR::operator&(BVar3,BailOutForDebuggerBits);
        if (BVar3 != BailOutInvalid) {
          BVar3 = IR::Instr::GetBailOutKind(instr);
          BVar3 = IR::operator&(BVar3,BailOutForDebuggerBits);
          bVar2 = IR::operator!(BVar3);
          if (!bVar2) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar4 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x369b,"(!(instr->GetBailOutKind() & IR::BailOutForDebuggerBits))",
                               "There should be no debugger bits in main bailout kind.");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar4 = 0;
          }
          BVar3 = IR::Instr::GetAuxBailOutKind(instr);
          bailOutInfo._4_4_ = IR::operator&(BVar3,BailOutForDebuggerBits);
          debuggerBailoutInstr = (BailOutInstr *)IR::Instr::ShareBailOut(instr);
          IR::Instr::ResetAuxBailOut(instr);
          goto LAB_00788784;
        }
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x36a7,"(0)","shouldn\'t get here");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
      bailOutInfo._4_4_ = BailOutInvalid;
    }
  }
  else {
    bVar2 = IR::Instr::HasAuxBailOut(instr);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x3682,"(!instr->HasAuxBailOut())","!instr->HasAuxBailOut()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    BVar3 = IR::Instr::GetBailOutKind(instr);
    e1 = IR::operator~(BailOutForDebuggerBits);
    BVar3 = IR::operator&(BVar3,e1);
    bVar2 = IR::operator!(BVar3);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x3683,"(!(instr->GetBailOutKind() & ~IR::BailOutForDebuggerBits))",
                         "There should only be debugger bailout bits in the instr.");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    BVar3 = IR::Instr::GetBailOutKind(instr);
    bailOutInfo._4_4_ = IR::operator&(BVar3,BailOutForDebuggerBits);
    if (bailOutInfo_00->bailOutInstr == instr) {
      bailOutInfo_00->bailOutInstr = (Instr *)0x0;
    }
    IR::Instr::ClearBailOutInfo(instr);
  }
LAB_00788784:
  pBStack_18 = (BailOutInstrTemplate<IR::Instr> *)instr;
  if (bailOutInfo._4_4_ != BailOutInvalid) {
    local_50 = IR::BailOutInstrTemplate<IR::Instr>::New
                         (BailForDebugger,bailOutInfo._4_4_,bailOutInfo_00,
                          bailOutInfo_00->bailOutFunc);
    IR::Instr::InsertAfter(instr,&local_50->super_Instr);
    if (debuggerBailoutInstr != (BailOutInstr *)0x0) {
      local_50 = debuggerBailoutInstr;
    }
    pBStack_18 = local_50;
  }
  return &pBStack_18->super_Instr;
}

Assistant:

IR::Instr* Lowerer::SplitBailForDebugger(IR::Instr* instr)
{
    Assert(m_func->IsJitInDebugMode() && instr->m_opcode != Js::OpCode::BailForDebugger);

    IR::BailOutKind debuggerBailOutKind;    // Used for splitted instr.
    BailOutInfo* bailOutInfo = instr->GetBailOutInfo();
    IR::Instr* sharedBailoutInstr = nullptr;

    if (instr->GetBailOutKind() & IR::BailOutForDebuggerBits)
    {
        // debugger bailout is not shared.
        Assert(!instr->HasAuxBailOut());
        AssertMsg(!(instr->GetBailOutKind() & ~IR::BailOutForDebuggerBits), "There should only be debugger bailout bits in the instr.");

        debuggerBailOutKind = instr->GetBailOutKind() & IR::BailOutForDebuggerBits;

        // There is no non-debugger bailout in the instr, still can't clear bailout info, as we use it for the splitted instr,
        // but we need to mark the bailout as hasn't been generated yet.
        if (bailOutInfo->bailOutInstr == instr)
        {
            // null will be picked up by following BailOutInstr::New which will change it to new bailout instr.
            bailOutInfo->bailOutInstr = nullptr;
        }

        // Remove bailout info from the original instr which from now on becomes just regular instr, w/o deallocating bailout info.
        instr->ClearBailOutInfo();
    }
    else if (instr->IsBranchInstr() && instr->HasBailOutInfo() && instr->HasAuxBailOut())
    {
        // Branches with shared bailout are lowered in LowerCondBranchCheckBailOut,
        // can't do here because we need to use BranchBailOutRecord but don't know which BrTrue/BrFalse to use for it.
        debuggerBailOutKind = IR::BailOutInvalid;
    }
    else if (instr->HasAuxBailOut() && instr->GetAuxBailOutKind() & IR::BailOutForDebuggerBits)
    {
        // debugger bailout is shared.
        AssertMsg(!(instr->GetBailOutKind() & IR::BailOutForDebuggerBits), "There should be no debugger bits in main bailout kind.");

        debuggerBailOutKind = instr->GetAuxBailOutKind() & IR::BailOutForDebuggerBits;

        // This will insert SharedBail instr after current instr and set bailOutInfo->bailOutInstr to the shared one.
        sharedBailoutInstr = instr->ShareBailOut();

        // As we extracted aux bail out, invalidate all tracks of it in the instr.
        instr->ResetAuxBailOut();
    }
    else
    {
        AssertMsg(FALSE, "shouldn't get here");
        debuggerBailOutKind = IR::BailOutInvalid;
    }

    if (debuggerBailOutKind != IR::BailOutInvalid)
    {
        IR::BailOutInstr* debuggerBailoutInstr = IR::BailOutInstr::New(
            Js::OpCode::BailForDebugger, debuggerBailOutKind, bailOutInfo, bailOutInfo->bailOutFunc);
        instr->InsertAfter(debuggerBailoutInstr);

        // Since we go backwards, we need to process extracted out bailout for debugger first.
        instr = sharedBailoutInstr ? sharedBailoutInstr : debuggerBailoutInstr;
    }

    return instr;
}